

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binproc.c
# Opt level: O0

void nn_binproc_connect(nn_ins_item *self,nn_ins_item *peer)

{
  nn_ep *pnVar1;
  nn_sinproc *owner;
  void *pvVar2;
  nn_sinproc *pnVar3;
  long in_RSI;
  long in_RDI;
  nn_sinproc *sinproc;
  nn_cinproc *cinproc;
  nn_binproc *binproc;
  nn_fsm *peer_00;
  nn_ep *ep;
  
  if (in_RDI == 0) {
    pnVar1 = (nn_ep *)0x0;
  }
  else {
    pnVar1 = (nn_ep *)(in_RDI + -0x60);
  }
  if (in_RSI == 0) {
    owner = (nn_sinproc *)0x0;
  }
  else {
    owner = (nn_sinproc *)(in_RSI + -0x60);
  }
  if (pnVar1->state != 2) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)(uint)pnVar1->state,
            "NN_BINPROC_STATE_ACTIVE",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/inproc/binproc.c"
            ,0x7a);
    fflush(_stderr);
    nn_err_abort();
  }
  ep = pnVar1;
  pnVar3 = owner;
  pvVar2 = nn_alloc_(0x165486);
  if (pvVar2 == (void *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/inproc/binproc.c"
            ,0x7d);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_sinproc_init(pnVar3,(int)((ulong)pvVar2 >> 0x20),ep,&owner->fsm);
  peer_00 = (nn_fsm *)&(pnVar1->item).prev;
  pnVar3 = (nn_sinproc *)((long)pvVar2 + 0x280);
  nn_list_end((nn_list *)&(pnVar1->item).prev);
  nn_list_insert((nn_list *)ep,(nn_list_item *)owner,(nn_list_item *)pnVar3);
  nn_sinproc_connect(pnVar3,peer_00);
  nn_ep_stat_increment((nn_ep *)pnVar3,(int)((ulong)peer_00 >> 0x20),(int)peer_00);
  return;
}

Assistant:

static void nn_binproc_connect (struct nn_ins_item *self,
    struct nn_ins_item *peer)
{
    struct nn_binproc *binproc;
    struct nn_cinproc *cinproc;
    struct nn_sinproc *sinproc;

    binproc = nn_cont (self, struct nn_binproc, item);
    cinproc = nn_cont (peer, struct nn_cinproc, item);

    nn_assert_state (binproc, NN_BINPROC_STATE_ACTIVE);

    sinproc = nn_alloc (sizeof (struct nn_sinproc), "sinproc");
    alloc_assert (sinproc);
    nn_sinproc_init (sinproc, NN_BINPROC_SRC_SINPROC,
        binproc->item.ep, &binproc->fsm);
    nn_list_insert (&binproc->sinprocs, &sinproc->item,
        nn_list_end (&binproc->sinprocs));
    nn_sinproc_connect (sinproc, &cinproc->fsm);

    nn_ep_stat_increment (binproc->item.ep, NN_STAT_ACCEPTED_CONNECTIONS, 1);
}